

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.h
# Opt level: O0

void __thiscall HighsHessian::HighsHessian(HighsHessian *this,HighsHessian *param_2)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI
            );
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)in_RDI
            );
  std::vector<double,_std::allocator<double>_>::vector(in_RSI,in_RDI);
  return;
}

Assistant:

HighsHessian() { clear(); }